

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O1

int __thiscall anon_unknown.dwarf_e23c::MovieState::parse_handler(MovieState *this)

{
  iterator *piVar1;
  size_t *psVar2;
  AVMediaType AVar3;
  bool bVar4;
  pthread_mutex_t *ppVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  AVFormatContext *pAVar10;
  ostream *poVar11;
  long lVar12;
  int *piVar13;
  _Elt_pointer pAVar14;
  undefined8 uVar15;
  lock_guard<std::mutex> _;
  ulong uVar16;
  unique_lock<std::mutex> lock_1;
  SDL_Event evt;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_130;
  uint local_120;
  uint local_11c;
  deque<AVPacket,_std::allocator<AVPacket>_> *local_118;
  deque<AVPacket,_std::allocator<AVPacket>_> *local_110;
  pthread_mutex_t *local_108;
  pthread_mutex_t *local_100;
  AVPacket local_f8;
  condition_variable *local_98;
  condition_variable *local_90;
  unique_lock<std::mutex> local_88 [2];
  uint local_64;
  
  pAVar10 = (this->mFormatCtx)._M_t.
            super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>._M_t.
            super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
            super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl;
  if (pAVar10->nb_streams == 0) {
    uVar6 = 0xffffffff;
    uVar7 = 0xffffffff;
  }
  else {
    uVar7 = 0xffffffff;
    uVar16 = 0;
    uVar6 = 0xffffffff;
    do {
      AVar3 = pAVar10->streams[uVar16]->codecpar->codec_type;
      if (((AVar3 == AVMEDIA_TYPE_VIDEO) && ((anonymous_namespace)::DisableVideo == '\0')) &&
         ((int)uVar7 < 0)) {
        uVar7 = streamComponentOpen(this,(uint)uVar16);
      }
      else if ((AVar3 == AVMEDIA_TYPE_AUDIO) && ((int)uVar6 < 0)) {
        uVar6 = streamComponentOpen(this,(uint)uVar16);
      }
      uVar16 = uVar16 + 1;
      pAVar10 = (this->mFormatCtx)._M_t.
                super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>.
                _M_t.
                super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                .super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl;
    } while (uVar16 < pAVar10->nb_streams);
  }
  if ((int)(uVar7 & uVar6) < 0) {
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(this->mFilename)._M_dataplus._M_p,
                         (this->mFilename)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": could not open codecs",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    LOCK();
    (this->mQuit)._M_base._M_i = true;
    UNLOCK();
  }
  lVar12 = av_gettime();
  (this->mClockBase).__r = lVar12 + 750000;
  if (-1 < (int)uVar6) {
    local_88[0]._M_device = (mutex_type *)0x0;
    local_f8.buf = (AVBufferRef *)operator_new(0x20);
    *(undefined ***)local_f8.buf = &PTR___State_0010ec60;
    *(AudioState **)(local_f8.buf + 8) = &this->mAudio;
    *(code **)(local_f8.buf + 0x10) = AudioState::handler;
    *(long *)(local_f8.buf + 0x18) = 0;
    std::thread::_M_start_thread(local_88,&local_f8,0);
    if (local_f8.buf != (AVBufferRef *)0x0) {
      (**(code **)(*(long *)local_f8.buf + 8))();
    }
    if ((this->mAudioThread)._M_id._M_thread != 0) goto LAB_0010726d;
    (this->mAudioThread)._M_id._M_thread = (native_handle_type)local_88[0]._M_device;
  }
  if (-1 < (int)uVar7) {
    local_88[0]._M_device = (mutex_type *)0x0;
    local_f8.buf = (AVBufferRef *)operator_new(0x20);
    *(undefined ***)local_f8.buf = &PTR___State_0010eca0;
    *(VideoState **)(local_f8.buf + 8) = &this->mVideo;
    *(code **)(local_f8.buf + 0x10) = VideoState::handler;
    *(long *)(local_f8.buf + 0x18) = 0;
    std::thread::_M_start_thread(local_88,&local_f8,0);
    if (local_f8.buf != (AVBufferRef *)0x0) {
      (**(code **)(*(long *)local_f8.buf + 8))();
    }
    if ((this->mVideoThread)._M_id._M_thread != 0) {
LAB_0010726d:
      std::terminate();
    }
    (this->mVideoThread)._M_id._M_thread = (native_handle_type)local_88[0]._M_device;
  }
  local_108 = (pthread_mutex_t *)&(this->mAudio).mPackets;
  local_100 = (pthread_mutex_t *)&(this->mVideo).mPackets;
  local_118 = &(this->mAudio).mPackets.mPackets;
  local_98 = &(this->mAudio).mPackets.mCondVar;
  local_110 = &(this->mVideo).mPackets.mPackets;
  local_90 = &(this->mVideo).mPackets.mCondVar;
  local_120 = uVar6;
  local_11c = uVar7;
LAB_00106dc9:
  if ((((this->mQuit)._M_base._M_i & 1U) == 0) &&
     (iVar8 = av_read_frame((this->mFormatCtx)._M_t.
                            super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                            .super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl,local_88),
     -1 < iVar8)) {
    if (local_64 == local_11c) {
LAB_00106e01:
      if (((this->mQuit)._M_base._M_i & 1U) == 0) {
        local_130._M_device = (mutex_type *)local_100;
        local_130._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_130);
        local_130._M_owns = true;
        if ((this->mVideo).mPackets.mTotalSize < 0xe00000) {
          local_f8.duration = 0;
          local_f8.pos = 0;
          local_f8.side_data = (AVPacketSideData *)0x0;
          local_f8.side_data_elems = 0;
          local_f8._60_4_ = 0;
          local_f8.size = 0;
          local_f8.stream_index = 0;
          local_f8.flags = 0;
          local_f8._44_4_ = 0;
          local_f8.dts = 0;
          local_f8.data = (uint8_t *)0x0;
          local_f8.buf = (AVBufferRef *)0x0;
          local_f8.pts = 0;
          local_f8.convergence_duration = 0;
          pAVar14 = (this->mVideo).mPackets.mPackets.
                    super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (pAVar14 ==
              *(_Elt_pointer *)
               ((long)&(this->mVideo).mPackets.mPackets.
                       super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x10) + -1) {
            std::deque<AVPacket,_std::allocator<AVPacket>_>::_M_push_back_aux<AVPacket>
                      (local_110,&local_f8);
          }
          else {
            pAVar14->duration = 0;
            pAVar14->pos = 0;
            pAVar14->side_data = (AVPacketSideData *)0x0;
            *(undefined8 *)&pAVar14->side_data_elems = 0;
            pAVar14->size = 0;
            pAVar14->stream_index = 0;
            *(undefined8 *)&pAVar14->flags = 0;
            pAVar14->dts = 0;
            pAVar14->data = (uint8_t *)0x0;
            pAVar14->buf = (AVBufferRef *)0x0;
            pAVar14->pts = 0;
            pAVar14->convergence_duration = 0;
            piVar1 = &(this->mVideo).mPackets.mPackets.
                      super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                      super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
          pAVar14 = (this->mVideo).mPackets.mPackets.
                    super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (pAVar14 ==
              *(_Elt_pointer *)
               ((long)&(this->mVideo).mPackets.mPackets.
                       super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                       super__Deque_impl_data._M_finish + 8)) {
            pAVar14 = (*(_Map_pointer *)
                        ((long)&(this->mVideo).mPackets.mPackets.
                                super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                                super__Deque_impl_data._M_finish + 0x18))[-1] + 5;
          }
          iVar9 = av_packet_ref(pAVar14 + -1,local_88);
          if (iVar9 != 0) {
            std::deque<AVPacket,_std::allocator<AVPacket>_>::pop_back(local_110);
            uVar7 = 1;
            goto LAB_00106ef5;
          }
          pAVar14 = (this->mVideo).mPackets.mPackets.
                    super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (pAVar14 ==
              *(_Elt_pointer *)
               ((long)&(this->mVideo).mPackets.mPackets.
                       super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                       super__Deque_impl_data._M_finish + 8)) {
            pAVar14 = (*(_Map_pointer *)
                        ((long)&(this->mVideo).mPackets.mPackets.
                                super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                                super__Deque_impl_data._M_finish + 0x18))[-1] + 5;
          }
          psVar2 = &(this->mVideo).mPackets.mTotalSize;
          *psVar2 = *psVar2 + (ulong)(uint)pAVar14[-1].size;
          bVar4 = true;
        }
        else {
          uVar7 = 0;
LAB_00106ef5:
          bVar4 = false;
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_130);
        if (bVar4) goto LAB_0010710a;
        if ((uVar7 & 1) != 0) goto LAB_0010710f;
        local_f8.buf = (AVBufferRef *)0x0;
        local_f8.pts = 100000000;
        do {
          iVar9 = nanosleep((timespec *)&local_f8,(timespec *)&local_f8);
          if (iVar9 != -1) break;
          piVar13 = __errno_location();
        } while (*piVar13 == 4);
        goto LAB_00106e01;
      }
    }
    else if (local_64 == local_120) {
LAB_00106f87:
      if (((this->mQuit)._M_base._M_i & 1U) == 0) {
        local_130._M_device = (mutex_type *)local_108;
        local_130._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_130);
        local_130._M_owns = true;
        if ((this->mAudio).mPackets.mTotalSize < 0x200000) {
          local_f8.duration = 0;
          local_f8.pos = 0;
          local_f8.side_data = (AVPacketSideData *)0x0;
          local_f8.side_data_elems = 0;
          local_f8._60_4_ = 0;
          local_f8.size = 0;
          local_f8.stream_index = 0;
          local_f8.flags = 0;
          local_f8._44_4_ = 0;
          local_f8.dts = 0;
          local_f8.data = (uint8_t *)0x0;
          local_f8.buf = (AVBufferRef *)0x0;
          local_f8.pts = 0;
          local_f8.convergence_duration = 0;
          pAVar14 = (this->mAudio).mPackets.mPackets.
                    super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (pAVar14 ==
              *(_Elt_pointer *)
               ((long)&(this->mAudio).mPackets.mPackets.
                       super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x10) + -1) {
            std::deque<AVPacket,_std::allocator<AVPacket>_>::_M_push_back_aux<AVPacket>
                      (local_118,&local_f8);
          }
          else {
            pAVar14->duration = 0;
            pAVar14->pos = 0;
            pAVar14->side_data = (AVPacketSideData *)0x0;
            *(undefined8 *)&pAVar14->side_data_elems = 0;
            pAVar14->size = 0;
            pAVar14->stream_index = 0;
            *(undefined8 *)&pAVar14->flags = 0;
            pAVar14->dts = 0;
            pAVar14->data = (uint8_t *)0x0;
            pAVar14->buf = (AVBufferRef *)0x0;
            pAVar14->pts = 0;
            pAVar14->convergence_duration = 0;
            piVar1 = &(this->mAudio).mPackets.mPackets.
                      super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                      super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
          pAVar14 = (this->mAudio).mPackets.mPackets.
                    super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (pAVar14 ==
              *(_Elt_pointer *)
               ((long)&(this->mAudio).mPackets.mPackets.
                       super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                       super__Deque_impl_data._M_finish + 8)) {
            pAVar14 = (*(_Map_pointer *)
                        ((long)&(this->mAudio).mPackets.mPackets.
                                super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                                super__Deque_impl_data._M_finish + 0x18))[-1] + 5;
          }
          iVar9 = av_packet_ref(pAVar14 + -1,local_88);
          if (iVar9 != 0) {
            std::deque<AVPacket,_std::allocator<AVPacket>_>::pop_back(local_118);
            uVar7 = 1;
            goto LAB_0010707b;
          }
          pAVar14 = (this->mAudio).mPackets.mPackets.
                    super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (pAVar14 ==
              *(_Elt_pointer *)
               ((long)&(this->mAudio).mPackets.mPackets.
                       super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                       super__Deque_impl_data._M_finish + 8)) {
            pAVar14 = (*(_Map_pointer *)
                        ((long)&(this->mAudio).mPackets.mPackets.
                                super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                                super__Deque_impl_data._M_finish + 0x18))[-1] + 5;
          }
          psVar2 = &(this->mAudio).mPackets.mTotalSize;
          *psVar2 = *psVar2 + (ulong)(uint)pAVar14[-1].size;
          bVar4 = true;
        }
        else {
          uVar7 = 0;
LAB_0010707b:
          bVar4 = false;
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_130);
        if (bVar4) goto LAB_0010710a;
        if ((uVar7 & 1) != 0) goto LAB_0010710f;
        local_f8.buf = (AVBufferRef *)0x0;
        local_f8.pts = 100000000;
        do {
          iVar9 = nanosleep((timespec *)&local_f8,(timespec *)&local_f8);
          if (iVar9 != -1) break;
          piVar13 = __errno_location();
        } while (*piVar13 == 4);
        goto LAB_00106f87;
      }
    }
    goto LAB_0010710f;
  }
  goto LAB_00107125;
LAB_0010710a:
  std::condition_variable::notify_one();
LAB_0010710f:
  av_packet_unref(local_88);
  if (iVar8 < 0) goto LAB_00107125;
  goto LAB_00106dc9;
LAB_00107125:
  ppVar5 = local_100;
  if ((this->mVideo).mCodecCtx._M_t.
      super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>._M_t.
      super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
      super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl != (AVCodecContext *)0x0) {
    iVar8 = pthread_mutex_lock(local_100);
    if (iVar8 != 0) goto LAB_00107272;
    (this->mVideo).mPackets.mFinished = true;
    pthread_mutex_unlock(ppVar5);
    std::condition_variable::notify_one();
  }
  ppVar5 = local_108;
  if ((this->mAudio).mCodecCtx._M_t.
      super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>._M_t.
      super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
      super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl != (AVCodecContext *)0x0) {
    iVar8 = pthread_mutex_lock(local_108);
    if (iVar8 != 0) {
LAB_00107272:
      uVar15 = std::__throw_system_error(iVar8);
      if (local_f8.buf != (AVBufferRef *)0x0) {
        (**(code **)(*(long *)local_f8.buf + 8))();
      }
      local_f8.buf = (AVBufferRef *)0x0;
      _Unwind_Resume(uVar15);
    }
    (this->mAudio).mPackets.mFinished = true;
    pthread_mutex_unlock(ppVar5);
    std::condition_variable::notify_one();
  }
  if ((this->mVideoThread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->mAudioThread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  LOCK();
  (this->mVideo).mEOS._M_base._M_i = true;
  UNLOCK();
  local_88[0]._M_device = &(this->mVideo).mPictQMutex;
  local_88[0]._M_owns = false;
  std::unique_lock<std::mutex>::lock(local_88);
  local_88[0]._M_owns = true;
  if (((this->mVideo).mFinalUpdate._M_base._M_i & 1U) == 0) {
    do {
      std::condition_variable::wait((unique_lock *)&(this->mVideo).mPictQCond);
    } while (((this->mVideo).mFinalUpdate._M_base._M_i & 1U) == 0);
  }
  std::unique_lock<std::mutex>::unlock(local_88);
  local_f8.pts = 0;
  local_f8.size = 0;
  local_f8.stream_index = 0;
  local_f8.flags = 0;
  local_f8._44_4_ = 0;
  local_f8.dts = 0;
  local_f8.data = (uint8_t *)0x0;
  local_f8.side_data = (AVPacketSideData *)0x0;
  local_f8.buf = (AVBufferRef *)0x8000;
  SDL_PushEvent();
  std::unique_lock<std::mutex>::~unique_lock(local_88);
  return 0;
}

Assistant:

int MovieState::parse_handler()
{
    auto &audio_queue = mAudio.mPackets;
    auto &video_queue = mVideo.mPackets;

    int video_index{-1};
    int audio_index{-1};

    /* Find the first video and audio streams */
    for(unsigned int i{0u};i < mFormatCtx->nb_streams;i++)
    {
        auto codecpar = mFormatCtx->streams[i]->codecpar;
        if(codecpar->codec_type == AVMEDIA_TYPE_VIDEO && !DisableVideo && video_index < 0)
            video_index = streamComponentOpen(i);
        else if(codecpar->codec_type == AVMEDIA_TYPE_AUDIO && audio_index < 0)
            audio_index = streamComponentOpen(i);
    }

    if(video_index < 0 && audio_index < 0)
    {
        std::cerr<< mFilename<<": could not open codecs" <<std::endl;
        mQuit = true;
    }

    /* Set the base time 750ms ahead of the current av time. */
    mClockBase = get_avtime() + milliseconds{750};

    if(audio_index >= 0)
        mAudioThread = std::thread{std::mem_fn(&AudioState::handler), &mAudio};
    if(video_index >= 0)
        mVideoThread = std::thread{std::mem_fn(&VideoState::handler), &mVideo};

    /* Main packet reading/dispatching loop */
    while(!mQuit.load(std::memory_order_relaxed))
    {
        AVPacket packet;
        if(av_read_frame(mFormatCtx.get(), &packet) < 0)
            break;

        /* Copy the packet into the queue it's meant for. */
        if(packet.stream_index == video_index)
        {
            while(!mQuit.load(std::memory_order_acquire) && !video_queue.put(&packet))
                std::this_thread::sleep_for(milliseconds{100});
        }
        else if(packet.stream_index == audio_index)
        {
            while(!mQuit.load(std::memory_order_acquire) && !audio_queue.put(&packet))
                std::this_thread::sleep_for(milliseconds{100});
        }

        av_packet_unref(&packet);
    }
    /* Finish the queues so the receivers know nothing more is coming. */
    if(mVideo.mCodecCtx) video_queue.setFinished();
    if(mAudio.mCodecCtx) audio_queue.setFinished();

    /* all done - wait for it */
    if(mVideoThread.joinable())
        mVideoThread.join();
    if(mAudioThread.joinable())
        mAudioThread.join();

    mVideo.mEOS = true;
    std::unique_lock<std::mutex> lock{mVideo.mPictQMutex};
    while(!mVideo.mFinalUpdate)
        mVideo.mPictQCond.wait(lock);
    lock.unlock();

    SDL_Event evt{};
    evt.user.type = FF_MOVIE_DONE_EVENT;
    SDL_PushEvent(&evt);

    return 0;
}